

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Slice_x86::forward
          (Slice_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined4 *puVar1;
  pointer pMVar2;
  uint uVar3;
  int _elempack;
  uint uVar4;
  Mat *src;
  ulong _elemsize;
  size_t sVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  int *piVar9;
  pointer pMVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  undefined4 *puVar15;
  void *pvVar16;
  int iVar17;
  undefined4 *puVar18;
  int iVar19;
  int iVar20;
  void *pvVar21;
  int iVar22;
  undefined4 *puVar23;
  void *pvVar24;
  long lVar25;
  int iVar26;
  void *pvVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  bool bVar31;
  Mat local_78;
  
  src = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_start;
  uVar3 = src->dims;
  _elemsize = src->elemsize;
  _elempack = src->elempack;
  uVar7 = (ulong)_elempack;
  lVar29 = *(long *)(&this->field_0xd0 + (long)this->_vptr_Slice_x86[-3]);
  iVar11 = *(int *)(&this->field_0x118 + (long)this->_vptr_Slice_x86[-3]);
  if (uVar3 == 1) {
    pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar12 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pMVar10;
    if (lVar12 != 0) {
      iVar14 = src->w;
      uVar13 = (lVar12 >> 3) * -0x71c71c71c71c71c7;
      lVar12 = 0;
      lVar25 = 0;
      iVar26 = 0;
      uVar28 = 0;
      do {
        uVar4 = *(uint *)(lVar29 + uVar28 * 4);
        uVar8 = (ulong)uVar4;
        if (uVar4 == 0xffffff17) {
          uVar8 = (ulong)(long)(iVar14 * _elempack - iVar26) / (uVar13 + lVar25);
        }
        bVar6 = (uVar8 & 3) == 0 & opt->use_packing_layout;
        iVar22 = (uint)bVar6 + (uint)bVar6 * 2 + 1;
        Mat::create((Mat *)((long)&pMVar10->data + lVar12),
                    (int)((long)((ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff) /
                         (long)iVar22),_elemsize / uVar7 << bVar6 * '\x02',iVar22,
                    opt->blob_allocator);
        pvVar27 = *(void **)((long)&pMVar10->data + lVar12);
        if (pvVar27 == (void *)0x0) {
          bVar31 = true;
        }
        else {
          bVar31 = (long)*(int *)((long)&pMVar10->c + lVar12) *
                   *(long *)((long)&pMVar10->cstep + lVar12) == 0;
        }
        if (bVar31) {
          return -100;
        }
        memcpy(pvVar27,(void *)((long)iVar26 * 4 + (long)src->data),
               (long)*(int *)((long)&pMVar10->w + lVar12) *
               *(long *)((long)&pMVar10->elemsize + lVar12));
        iVar26 = (int)uVar8 + iVar26;
        uVar28 = uVar28 + 1;
        pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar13 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar10 >> 3) *
                 -0x71c71c71c71c71c7;
        lVar25 = lVar25 + -1;
        lVar12 = lVar12 + 0x48;
      } while (uVar28 < uVar13);
    }
  }
  iVar11 = (iVar11 >> 0x1f & uVar3) + iVar11;
  if ((uVar3 == 2) && (iVar11 == 0)) {
    iVar14 = src->w;
    pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar12 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pMVar10;
    bVar31 = lVar12 != 0;
    if (bVar31) {
      iVar26 = src->h;
      uVar13 = (lVar12 >> 3) * -0x71c71c71c71c71c7;
      lVar25 = 0;
      lVar12 = 0;
      iVar22 = 0;
      uVar28 = 0;
      do {
        uVar4 = *(uint *)(lVar29 + uVar28 * 4);
        uVar8 = (ulong)uVar4;
        if (uVar4 == 0xffffff17) {
          uVar8 = (ulong)(long)(iVar26 * _elempack - iVar22) / (uVar13 + lVar12);
        }
        bVar6 = (uVar8 & 3) == 0 & opt->use_packing_layout;
        iVar17 = (uint)bVar6 + (uint)bVar6 * 2 + 1;
        Mat::create((Mat *)((long)&pMVar10->data + lVar25),iVar14,
                    (int)((long)((ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff) /
                         (long)iVar17),_elemsize / uVar7 << bVar6 * '\x02',iVar17,
                    opt->blob_allocator);
        if (*(long *)((long)&pMVar10->data + lVar25) == 0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar10->c + lVar25) * *(long *)((long)&pMVar10->cstep + lVar25)
            == 0) {
          return -100;
        }
        iVar22 = iVar22 + (int)uVar8;
        uVar28 = uVar28 + 1;
        pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar13 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar10 >> 3) *
                 -0x71c71c71c71c71c7;
        lVar12 = lVar12 + -1;
        lVar25 = lVar25 + 0x48;
        bVar31 = uVar28 < uVar13;
      } while (bVar31);
    }
    pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    iVar26 = pMVar10->elempack;
    lVar12 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pMVar10;
    if (lVar12 != 0) {
      lVar12 = (lVar12 >> 3) * -0x71c71c71c71c71c7;
      lVar12 = lVar12 + (ulong)(lVar12 == 0);
      piVar9 = &pMVar10->elempack;
      do {
        if (*piVar9 < iVar26) {
          iVar26 = *piVar9;
        }
        piVar9 = piVar9 + 0x12;
        lVar12 = lVar12 + -1;
      } while (lVar12 != 0);
    }
    local_78.data = src->data;
    piVar9 = src->refcount;
    local_78.refcount._0_4_ = SUB84(piVar9,0);
    local_78.refcount._4_4_ = (undefined4)((ulong)piVar9 >> 0x20);
    local_78.elemsize._0_4_ = (undefined4)src->elemsize;
    local_78.elemsize._4_4_ = (undefined4)(src->elemsize >> 0x20);
    local_78.elempack = src->elempack;
    local_78.allocator = src->allocator;
    local_78.dims = src->dims;
    local_78.w = src->w;
    local_78.h = src->h;
    local_78.d = src->d;
    local_78.c = src->c;
    local_78.cstep = src->cstep;
    if (piVar9 != (int *)0x0) {
      LOCK();
      *piVar9 = *piVar9 + 1;
      UNLOCK();
    }
    if (iVar26 < _elempack) {
      convert_packing(src,&local_78,iVar26,opt);
    }
    pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_finish != pMVar10) {
      lVar12 = (long)iVar14;
      uVar13 = 0;
      puVar15 = (undefined4 *)local_78.data;
      do {
        pMVar10 = pMVar10 + uVar13;
        iVar22 = pMVar10->elempack;
        if (((iVar26 == 1) && (iVar22 == 4)) && (iVar17 = pMVar10->h, 0 < (long)iVar17)) {
          pvVar27 = pMVar10->data;
          iVar20 = pMVar10->w;
          sVar5 = pMVar10->elemsize;
          lVar25 = 0;
          do {
            if (0 < iVar14) {
              puVar18 = (undefined4 *)((long)iVar20 * sVar5 * lVar25 + (long)pvVar27);
              puVar23 = puVar15;
              iVar19 = iVar14;
              do {
                *puVar18 = *puVar23;
                puVar18[1] = puVar23[lVar12];
                puVar18[2] = puVar23[iVar14 * 2];
                puVar1 = puVar23 + iVar14 * 3;
                puVar23 = puVar23 + 1;
                puVar18[3] = *puVar1;
                puVar18 = puVar18 + 4;
                iVar19 = iVar19 + -1;
              } while (iVar19 != 0);
            }
            puVar15 = puVar15 + lVar12 * 4;
            lVar25 = lVar25 + 1;
          } while (lVar25 != iVar17);
        }
        if (iVar26 == iVar22) {
          lVar25 = pMVar10->h * lVar12;
          memcpy(pMVar10->data,puVar15,pMVar10->elemsize * lVar25);
          puVar15 = puVar15 + (long)(int)lVar25 * (long)pMVar10->elempack;
        }
        uVar13 = uVar13 + 1;
        pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      } while (uVar13 < (ulong)(((long)(top_blobs->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar10 >>
                                3) * -0x71c71c71c71c71c7));
    }
    piVar9 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar9 != (int *)0x0) {
      LOCK();
      *piVar9 = *piVar9 + -1;
      UNLOCK();
      if (*piVar9 == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          if ((undefined4 *)local_78.data != (undefined4 *)0x0) {
            free(local_78.data);
          }
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_78.cstep = 0;
    local_78.data = (void *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = 0;
    local_78.elemsize._4_4_ = 0;
    local_78.elempack = 0;
    local_78.dims = 0;
    local_78.w = 0;
    local_78.h = 0;
    local_78.d = 0;
    local_78.c = 0;
    if (bVar31) {
      return -100;
    }
  }
  if ((uVar3 == 2) && (iVar11 == 1)) {
    uVar4 = src->h;
    pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar12 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pMVar10;
    bVar31 = lVar12 != 0;
    if (bVar31) {
      iVar14 = src->w;
      uVar13 = (lVar12 >> 3) * -0x71c71c71c71c71c7;
      lVar25 = 0;
      lVar12 = 0;
      iVar26 = 0;
      uVar28 = 0;
      do {
        iVar22 = *(int *)(lVar29 + uVar28 * 4);
        if (iVar22 == -0xe9) {
          iVar22 = (int)((ulong)((long)iVar14 - (long)iVar26) / (uVar13 + lVar12));
        }
        Mat::create((Mat *)((long)&pMVar10->data + lVar25),iVar22,uVar4,_elemsize,_elempack,
                    opt->blob_allocator);
        if (*(long *)((long)&pMVar10->data + lVar25) == 0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar10->c + lVar25) * *(long *)((long)&pMVar10->cstep + lVar25)
            == 0) {
          return -100;
        }
        iVar26 = iVar26 + iVar22;
        uVar28 = uVar28 + 1;
        pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar13 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar10 >> 3) *
                 -0x71c71c71c71c71c7;
        lVar12 = lVar12 + -1;
        lVar25 = lVar25 + 0x48;
        bVar31 = uVar28 < uVar13;
      } while (bVar31);
    }
    if (0 < (int)uVar4) {
      uVar13 = 0;
      do {
        pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if ((top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish != pMVar10) {
          pvVar27 = (void *)((long)src->w * uVar13 * src->elemsize + (long)src->data);
          lVar12 = 0x2c;
          uVar28 = 0;
          do {
            lVar25 = (long)*(int *)((long)&pMVar10->data + lVar12);
            memcpy((void *)(uVar13 * lVar25 * *(long *)((long)pMVar10 + lVar12 + -0x1c) +
                           *(long *)((long)pMVar10 + lVar12 + -0x2c)),pvVar27,lVar25 * _elemsize);
            pvVar27 = (void *)((long)pvVar27 +
                              (long)*(int *)((long)&pMVar10->data + lVar12) * uVar7 * 4);
            uVar28 = uVar28 + 1;
            pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start;
            lVar12 = lVar12 + 0x48;
          } while (uVar28 < (ulong)(((long)(top_blobs->
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pMVar10 >> 3) * -0x71c71c71c71c71c7));
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != uVar4);
    }
    if (bVar31) {
      return -100;
    }
  }
  if ((uVar3 == 3) && (iVar11 == 0)) {
    pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar12 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pMVar10;
    bVar31 = lVar12 != 0;
    if (bVar31) {
      iVar14 = src->w;
      iVar26 = src->h;
      iVar22 = src->c;
      uVar13 = (lVar12 >> 3) * -0x71c71c71c71c71c7;
      lVar25 = 0;
      lVar12 = 0;
      uVar28 = 0;
      iVar17 = 0;
      do {
        uVar4 = *(uint *)(lVar29 + uVar28 * 4);
        uVar8 = (ulong)uVar4;
        if (uVar4 == 0xffffff17) {
          uVar8 = (ulong)(long)(iVar22 * _elempack - iVar17) / (uVar13 + lVar12);
        }
        bVar6 = (uVar8 & 3) == 0 & opt->use_packing_layout;
        iVar20 = (uint)bVar6 + (uint)bVar6 * 2 + 1;
        Mat::create((Mat *)((long)&pMVar10->data + lVar25),iVar14,iVar26,
                    (int)((long)((ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff) /
                         (long)iVar20),_elemsize / uVar7 << bVar6 * '\x02',iVar20,
                    opt->blob_allocator);
        if (*(long *)((long)&pMVar10->data + lVar25) == 0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar10->c + lVar25) * *(long *)((long)&pMVar10->cstep + lVar25)
            == 0) {
          return -100;
        }
        iVar17 = iVar17 + (int)uVar8;
        uVar28 = uVar28 + 1;
        pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar13 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar10 >> 3) *
                 -0x71c71c71c71c71c7;
        lVar12 = lVar12 + -1;
        lVar25 = lVar25 + 0x48;
        bVar31 = uVar28 < uVar13;
      } while (bVar31);
    }
    pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    iVar14 = pMVar10->elempack;
    lVar12 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pMVar10;
    if (lVar12 != 0) {
      lVar12 = (lVar12 >> 3) * -0x71c71c71c71c71c7;
      lVar12 = lVar12 + (ulong)(lVar12 == 0);
      piVar9 = &pMVar10->elempack;
      do {
        if (*piVar9 < iVar14) {
          iVar14 = *piVar9;
        }
        piVar9 = piVar9 + 0x12;
        lVar12 = lVar12 + -1;
      } while (lVar12 != 0);
    }
    local_78.data = src->data;
    piVar9 = src->refcount;
    local_78.refcount._0_4_ = SUB84(piVar9,0);
    local_78.refcount._4_4_ = (undefined4)((ulong)piVar9 >> 0x20);
    local_78.elemsize._0_4_ = (undefined4)src->elemsize;
    local_78.elemsize._4_4_ = (undefined4)(src->elemsize >> 0x20);
    local_78.elempack = src->elempack;
    local_78.allocator = src->allocator;
    local_78.dims = src->dims;
    local_78.w = src->w;
    local_78.h = src->h;
    local_78.d = src->d;
    local_78.c = src->c;
    local_78.cstep = src->cstep;
    if (piVar9 != (int *)0x0) {
      LOCK();
      *piVar9 = *piVar9 + 1;
      UNLOCK();
    }
    if (iVar14 < _elempack) {
      convert_packing(src,&local_78,iVar14,opt);
    }
    pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_finish != pMVar10) {
      uVar13 = 0;
      uVar28 = 0;
      do {
        pMVar2 = pMVar10 + uVar13;
        if (((iVar14 == 1) && (pMVar10[uVar13].elempack == 4)) &&
           (iVar26 = pMVar2->c, 0 < (long)iVar26)) {
          iVar22 = pMVar2->h * pMVar2->w;
          uVar28 = (ulong)(int)uVar28;
          lVar25 = local_78.cstep * CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize);
          pvVar16 = (void *)((uVar28 + 3) * lVar25 + (long)local_78.data);
          lVar12 = lVar25 * 4;
          pvVar21 = (void *)((uVar28 + 2) * lVar25 + (long)local_78.data);
          pvVar24 = (void *)((uVar28 + 1) * lVar25 + (long)local_78.data);
          pvVar27 = (void *)(lVar25 * uVar28 + (long)local_78.data);
          lVar25 = 0;
          do {
            if (0 < iVar22) {
              puVar15 = (undefined4 *)
                        (pMVar2->cstep * lVar25 * pMVar2->elemsize + (long)pMVar2->data);
              lVar30 = 0;
              do {
                *puVar15 = *(undefined4 *)((long)pvVar27 + lVar30 * 4);
                puVar15[1] = *(undefined4 *)((long)pvVar24 + lVar30 * 4);
                puVar15[2] = *(undefined4 *)((long)pvVar21 + lVar30 * 4);
                puVar15[3] = *(undefined4 *)((long)pvVar16 + lVar30 * 4);
                puVar15 = puVar15 + 4;
                lVar30 = lVar30 + 1;
              } while (iVar22 != (int)lVar30);
            }
            uVar28 = uVar28 + 4;
            lVar25 = lVar25 + 1;
            pvVar16 = (void *)((long)pvVar16 + lVar12);
            pvVar21 = (void *)((long)pvVar21 + lVar12);
            pvVar24 = (void *)((long)pvVar24 + lVar12);
            pvVar27 = (void *)((long)pvVar27 + lVar12);
          } while (lVar25 != iVar26);
        }
        if (iVar14 == pMVar2->elempack) {
          memcpy(pMVar2->data,
                 (void *)(local_78.cstep * (long)(int)uVar28 *
                          CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize) +
                         (long)local_78.data),
                 (long)((int)pMVar2->cstep * pMVar2->c) * pMVar2->elemsize);
          uVar28 = (ulong)(uint)((int)uVar28 + pMVar2->c);
        }
        uVar13 = uVar13 + 1;
        pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      } while (uVar13 < (ulong)(((long)(top_blobs->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar10 >>
                                3) * -0x71c71c71c71c71c7));
    }
    piVar9 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar9 != (int *)0x0) {
      LOCK();
      *piVar9 = *piVar9 + -1;
      UNLOCK();
      if (*piVar9 == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          if (local_78.data != (void *)0x0) {
            free(local_78.data);
          }
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_78.cstep = 0;
    local_78.data = (void *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = 0;
    local_78.elemsize._4_4_ = 0;
    local_78.elempack = 0;
    local_78.dims = 0;
    local_78.w = 0;
    local_78.h = 0;
    local_78.d = 0;
    local_78.c = 0;
    if (bVar31) {
      return -100;
    }
  }
  if ((uVar3 == 3) && (iVar11 == 1)) {
    uVar4 = src->c;
    pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar12 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pMVar10;
    bVar31 = lVar12 != 0;
    if (bVar31) {
      iVar14 = src->w;
      iVar26 = src->h;
      uVar13 = (lVar12 >> 3) * -0x71c71c71c71c71c7;
      lVar25 = 0;
      lVar12 = 0;
      uVar28 = 0;
      iVar22 = 0;
      do {
        iVar17 = *(int *)(lVar29 + uVar28 * 4);
        if (iVar17 == -0xe9) {
          iVar17 = (int)((ulong)((long)iVar26 - (long)iVar22) / (uVar13 + lVar12));
        }
        Mat::create((Mat *)((long)&pMVar10->data + lVar25),iVar14,iVar17,uVar4,_elemsize,_elempack,
                    opt->blob_allocator);
        if (*(long *)((long)&pMVar10->data + lVar25) == 0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar10->c + lVar25) * *(long *)((long)&pMVar10->cstep + lVar25)
            == 0) {
          return -100;
        }
        iVar22 = iVar22 + iVar17;
        uVar28 = uVar28 + 1;
        pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar13 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar10 >> 3) *
                 -0x71c71c71c71c71c7;
        lVar12 = lVar12 + -1;
        lVar25 = lVar25 + 0x48;
        bVar31 = uVar28 < uVar13;
      } while (bVar31);
    }
    if (0 < (int)uVar4) {
      uVar13 = 0;
      do {
        pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if ((top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish != pMVar10) {
          pvVar27 = (void *)(src->cstep * uVar13 * src->elemsize + (long)src->data);
          lVar12 = 0x40;
          uVar28 = 0;
          do {
            lVar25 = (long)*(int *)((long)pMVar10 + lVar12 + -0x10) *
                     (long)*(int *)((long)pMVar10 + lVar12 + -0x14);
            memcpy((void *)(*(long *)((long)&pMVar10->data + lVar12) * uVar13 *
                            *(long *)((long)pMVar10 + lVar12 + -0x30) +
                           *(long *)((long)pMVar10 + lVar12 + -0x40)),pvVar27,lVar25 * _elemsize);
            pvVar27 = (void *)((long)pvVar27 + (long)((int)lVar25 * _elempack) * 4);
            uVar28 = uVar28 + 1;
            pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start;
            lVar12 = lVar12 + 0x48;
          } while (uVar28 < (ulong)(((long)(top_blobs->
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pMVar10 >> 3) * -0x71c71c71c71c71c7));
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != uVar4);
    }
    if (bVar31) {
      return -100;
    }
  }
  if ((uVar3 == 3) && (iVar11 == 2)) {
    uVar3 = src->h;
    uVar4 = src->c;
    pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar12 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pMVar10;
    bVar31 = lVar12 != 0;
    if (bVar31) {
      iVar11 = src->w;
      uVar13 = (lVar12 >> 3) * -0x71c71c71c71c71c7;
      lVar12 = 0;
      lVar25 = 0;
      uVar28 = 0;
      iVar14 = 0;
      do {
        iVar26 = *(int *)(lVar29 + uVar28 * 4);
        if (iVar26 == -0xe9) {
          iVar26 = (int)((ulong)((long)iVar11 - (long)iVar14) / (uVar13 + lVar25));
        }
        Mat::create((Mat *)((long)&pMVar10->data + lVar12),iVar26,uVar3,uVar4,_elemsize,_elempack,
                    opt->blob_allocator);
        if (*(long *)((long)&pMVar10->data + lVar12) == 0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar10->c + lVar12) * *(long *)((long)&pMVar10->cstep + lVar12)
            == 0) {
          return -100;
        }
        iVar14 = iVar14 + iVar26;
        uVar28 = uVar28 + 1;
        pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar13 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar10 >> 3) *
                 -0x71c71c71c71c71c7;
        lVar25 = lVar25 + -1;
        lVar12 = lVar12 + 0x48;
        bVar31 = uVar28 < uVar13;
      } while (bVar31);
    }
    if (0 < (int)uVar4) {
      uVar13 = 0;
      do {
        if (0 < (int)uVar3) {
          pvVar27 = (void *)(src->cstep * uVar13 * src->elemsize + (long)src->data);
          uVar28 = 0;
          do {
            pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start;
            if ((top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish != pMVar10) {
              lVar29 = 0x40;
              uVar8 = 0;
              do {
                lVar12 = *(long *)((long)pMVar10 + lVar29 + -0x30);
                lVar25 = (long)*(int *)((long)pMVar10 + lVar29 + -0x14);
                memcpy((void *)(lVar12 * uVar28 * lVar25 +
                               *(long *)((long)&pMVar10->data + lVar29) * uVar13 * lVar12 +
                               *(long *)((long)pMVar10 + lVar29 + -0x40)),pvVar27,lVar25 * _elemsize
                      );
                pvVar27 = (void *)((long)pvVar27 +
                                  (long)*(int *)((long)pMVar10 + lVar29 + -0x14) * uVar7 * 4);
                uVar8 = uVar8 + 1;
                pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_start;
                lVar29 = lVar29 + 0x48;
              } while (uVar8 < (ulong)(((long)(top_blobs->
                                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                              )._M_impl.super__Vector_impl_data._M_finish -
                                        (long)pMVar10 >> 3) * -0x71c71c71c71c71c7));
            }
            uVar28 = uVar28 + 1;
          } while (uVar28 != uVar3);
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != uVar4);
    }
    if (bVar31) {
      return -100;
    }
  }
  return 0;
}

Assistant:

int Slice_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;
    const int* slices_ptr = slices;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        // slice vector
        int w = bottom_blob.w * elempack;
        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            int out_elempack = 1;
#if __SSE2__
            if (opt.use_packing_layout)
            {
#if __AVX__
                out_elempack = slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#else
                out_elempack = slice % 4 == 0 ? 4 : 1;
#endif
            }
#endif // __SSE2__
            size_t out_elemsize = elemsize / elempack * out_elempack;

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            const float* ptr = (const float*)bottom_blob + q;
            float* outptr = top_blob;
            memcpy(outptr, ptr, top_blob.w * top_blob.elemsize);

            q += slice;
        }
    }

    if (dims == 2 && positive_axis == 0)
    {
        // slice image height
        int w = bottom_blob.w;
        int h = bottom_blob.h * elempack;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (h - q) / (top_blobs.size() - i);
            }

            int out_elempack = 1;
#if __SSE2__
            if (opt.use_packing_layout)
            {
#if __AVX__
                out_elempack = slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#else
                out_elempack = slice % 4 == 0 ? 4 : 1;
#endif
            }
#endif // __SSE2__
            size_t out_elemsize = elemsize / elempack * out_elempack;

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        size_t out_elemsize = top_blobs[0].elemsize;
        int out_elempack = top_blobs[0].elempack;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            out_elemsize = std::min(out_elemsize, top_blobs[i].elemsize);
            out_elempack = std::min(out_elempack, top_blobs[i].elempack);
        }

        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > out_elempack)
        {
            convert_packing(bottom_blob, bottom_blob_unpacked, out_elempack, opt);
        }

        const float* ptr = bottom_blob_unpacked;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            Mat& top_blob = top_blobs[i];

#if __SSE2__
#if __AVX__
            if (out_elempack == 4 && top_blob.elempack == 8)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w * 4;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r1[0];
                        outptr0[5] = r1[1];
                        outptr0[6] = r1[2];
                        outptr0[7] = r1[3];

                        r0 += 4;
                        r1 += 4;
                        outptr0 += 8;
                    }

                    ptr += w * 8;
                }
            }
            if (out_elempack == 1 && top_blob.elempack == 8)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w;
                    const float* r2 = ptr + w * 2;
                    const float* r3 = ptr + w * 3;
                    const float* r4 = ptr + w * 4;
                    const float* r5 = ptr + w * 5;
                    const float* r6 = ptr + w * 6;
                    const float* r7 = ptr + w * 7;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;
                        outptr0[4] = *r4++;
                        outptr0[5] = *r5++;
                        outptr0[6] = *r6++;
                        outptr0[7] = *r7++;

                        outptr0 += 8;
                    }

                    ptr += w * 8;
                }
            }
#endif // __AVX__
            if (out_elempack == 1 && top_blob.elempack == 4)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w;
                    const float* r2 = ptr + w * 2;
                    const float* r3 = ptr + w * 3;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;

                        outptr0 += 4;
                    }

                    ptr += w * 4;
                }
            }
#endif // __SSE2__
            if (out_elempack == top_blob.elempack)
            {
                // 1-1 4-4 8-8
                int size = w * top_blob.h;

                float* outptr = top_blob;
                memcpy(outptr, ptr, size * top_blob.elemsize);

                ptr += size * top_blob.elempack;
            }
        }
    }

    if (dims == 2 && positive_axis == 1)
    {
        // slice image width
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int j = 0; j < h; j++)
        {
            const float* ptr = bottom_blob.row<const float>(j);
            for (size_t i = 0; i < top_blobs.size(); i++)
            {
                Mat& top_blob = top_blobs[i];

                float* outptr = top_blob.row(j);
                memcpy(outptr, ptr, top_blob.w * elemsize);

                ptr += top_blob.w * elempack;
            }
        }
    }

    if (dims == 3 && positive_axis == 0)
    {
        // slice dim channel
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c * elempack;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (channels - q) / (top_blobs.size() - i);
            }

            int out_elempack = 1;
#if __SSE2__
            if (opt.use_packing_layout)
            {
#if __AVX__
                out_elempack = slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#else
                out_elempack = slice % 4 == 0 ? 4 : 1;
#endif
            }
#endif // __SSE2__
            size_t out_elemsize = elemsize / elempack * out_elempack;

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, h, slice / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        size_t out_elemsize = top_blobs[0].elemsize;
        int out_elempack = top_blobs[0].elempack;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            out_elemsize = std::min(out_elemsize, top_blobs[i].elemsize);
            out_elempack = std::min(out_elempack, top_blobs[i].elempack);
        }

        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > out_elempack)
        {
            convert_packing(bottom_blob, bottom_blob_unpacked, out_elempack, opt);
        }

        int p = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            Mat& top_blob = top_blobs[i];

#if __SSE2__
#if __AVX__
            if (out_elempack == 4 && top_blob.elempack == 8)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r1[0];
                        outptr0[5] = r1[1];
                        outptr0[6] = r1[2];
                        outptr0[7] = r1[3];

                        r0 += 4;
                        r1 += 4;
                        outptr0 += 8;
                    }

                    p += 2;
                }
            }
            if (out_elempack == 1 && top_blob.elempack == 8)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);
                    const float* r2 = bottom_blob_unpacked.channel(p + 2);
                    const float* r3 = bottom_blob_unpacked.channel(p + 3);
                    const float* r4 = bottom_blob_unpacked.channel(p + 4);
                    const float* r5 = bottom_blob_unpacked.channel(p + 5);
                    const float* r6 = bottom_blob_unpacked.channel(p + 6);
                    const float* r7 = bottom_blob_unpacked.channel(p + 7);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;
                        outptr0[4] = *r4++;
                        outptr0[5] = *r5++;
                        outptr0[6] = *r6++;
                        outptr0[7] = *r7++;

                        outptr0 += 8;
                    }

                    p += 8;
                }
            }
#endif // __AVX__
            if (out_elempack == 1 && top_blob.elempack == 4)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);
                    const float* r2 = bottom_blob_unpacked.channel(p + 2);
                    const float* r3 = bottom_blob_unpacked.channel(p + 3);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;

                        outptr0 += 4;
                    }

                    p += 4;
                }
            }
#endif // __SSE2__
            if (out_elempack == top_blob.elempack)
            {
                // 1-1 4-4 8-8
                int size = top_blob.total();

                const float* ptr = bottom_blob_unpacked.channel(p);
                float* outptr = top_blob;
                memcpy(outptr, ptr, size * top_blob.elemsize);

                p += top_blob.c;
            }
        }
    }

    if (dims == 3 && positive_axis == 1)
    {
        // slice dim height
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (h - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < channels; p++)
        {
            const float* ptr = bottom_blob.channel(p);

            for (size_t i = 0; i < top_blobs.size(); i++)
            {
                Mat& top_blob = top_blobs[i];

                int size = top_blob.w * top_blob.h;

                float* outptr = top_blob.channel(p);
                memcpy(outptr, ptr, size * elemsize);

                ptr += size * elempack;
            }
        }
    }

    if (dims == 3 && positive_axis == 2)
    {
        // slice dim width
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < channels; p++)
        {
            const float* ptr = bottom_blob.channel(p);

            for (int j = 0; j < h; j++)
            {
                for (size_t i = 0; i < top_blobs.size(); i++)
                {
                    Mat& top_blob = top_blobs[i];

                    float* outptr = top_blob.channel(p).row(j);
                    memcpy(outptr, ptr, top_blob.w * elemsize);

                    ptr += top_blob.w * elempack;
                }
            }
        }
    }

    return 0;
}